

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O0

void PID_Increment_Reset(PID_Increment_t *PID_Increment,float Kp,float Ki,float Kd,float Deadband,
                        float MaxIncrease,float MaxInt,float MaxOutput)

{
  float MaxOutput_local;
  float MaxInt_local;
  float MaxIncrease_local;
  float Deadband_local;
  float Kd_local;
  float Ki_local;
  float Kp_local;
  PID_Increment_t *PID_Increment_local;
  
  PID_Increment->Kp = Kp;
  PID_Increment->Ki = Ki;
  PID_Increment->Kd = Kd;
  PID_Increment->Deadband = Deadband;
  PID_Increment->MaxIncrease = MaxIncrease;
  PID_Increment->MaxInt = MaxInt;
  PID_Increment->MaxOutput = MaxOutput;
  PID_Increment->Error = 0.0;
  PID_Increment->LastError = 0.0;
  PID_Increment->PrevError = 0.0;
  PID_Increment->IntError = 0.0;
  PID_Increment->Feedback = 0.0;
  PID_Increment->Ref = 0.0;
  PID_Increment->Output = 0.0;
  return;
}

Assistant:

void PID_Increment_Reset(
	PID_Increment_t *PID_Increment, float Kp, float Ki, float Kd,
	float Deadband, float MaxIncrease, float MaxInt, float MaxOutput)
{
	/*�趨PIDϵ������������*/
	PID_Increment->Kp = Kp;
	PID_Increment->Ki = Ki;
	PID_Increment->Kd = Kd;
	PID_Increment->Deadband = Deadband;
	PID_Increment->MaxIncrease = MaxIncrease;
	PID_Increment->MaxInt = MaxInt;
	PID_Increment->MaxOutput = MaxOutput;

	/*����������¼*/
	PID_Increment->Error = 0.0f;
	PID_Increment->LastError = 0.0f;
	PID_Increment->PrevError = 0.0f;
	PID_Increment->IntError = 0.0f;

	/*������������*/
	PID_Increment->Feedback = 0.0f;
	PID_Increment->Ref = 0.0f;
	PID_Increment->Output = 0.0f;
}